

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

bool ON_WildCardMatch(char *s,char *pattern)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  bool bVar4;
  
LAB_005c09d1:
  if ((pattern != (char *)0x0) && (cVar1 = *pattern, cVar1 != '\0')) {
    if (cVar1 != '*') {
      do {
        if (cVar1 == '?') {
          if (*s == '\0') {
            return false;
          }
        }
        else {
          if (cVar1 == '\\') {
            cVar1 = pattern[1];
            pcVar3 = pattern + 1;
            if ((cVar1 != '?') && (cVar1 != '*')) {
              if (*s != '\\') {
                return false;
              }
              goto LAB_005c0a2d;
            }
          }
          else {
            pcVar3 = pattern;
            if (cVar1 == '*') goto LAB_005c09d1;
          }
          if (cVar1 != *s) {
            return false;
          }
          pattern = pcVar3;
          if (cVar1 == '\0') goto LAB_005c0a79;
        }
LAB_005c0a2d:
        s = s + 1;
        cVar1 = pattern[1];
        pattern = pattern + 1;
      } while( true );
    }
    do {
      pcVar3 = pattern + 1;
      pattern = pattern + 1;
    } while (*pcVar3 == '*');
    if (*pcVar3 != '\0') {
      do {
        bVar4 = *s != '\0';
        if (!bVar4) {
          return bVar4;
        }
        bVar2 = ON_WildCardMatch(s,pattern);
        s = s + 1;
      } while (!bVar2);
      return bVar4;
    }
    goto LAB_005c0a79;
  }
  if (s == (char *)0x0) {
LAB_005c0a79:
    bVar4 = true;
  }
  else {
    bVar4 = *s == '\0';
  }
  return bVar4;
}

Assistant:

bool ON_WildCardMatch(const char* s, const char* pattern)
{
  if ( !pattern || !pattern[0] ) {
    return ( !s || !s[0] ) ? true : false;
  }

  if ( *pattern == '*' ) {
    pattern++;
    while ( *pattern == '*' )
      pattern++;
    
    if ( !pattern[0] )
      return true;

    while (*s) {
      if ( ON_WildCardMatch(s,pattern) )
        return true;
      s++;
    }

    return false;
  }

  while ( *pattern != '*' )
  {
    if ( *pattern == '?' ) {
      if ( *s) {
        pattern++;
        s++;
        continue;
      }
      return false;
    }
    
    if ( *pattern == '\\' ) {
      switch( pattern[1] )
      {
      case '*':
      case '?':
        pattern++;
        break;
      }
    }
    if ( *pattern != *s ) {
      return false;
    }

    if ( *s == 0 )
      return true;

    pattern++;
    s++;
  }
  
  return ON_WildCardMatch(s,pattern);
}